

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

TBox<float> *
lumeview::BoxFromCoords<float>
          (TBox<float> *__return_storage_ptr__,float *coords,index_t num,index_t stride)

{
  uint *puVar1;
  float *pfVar2;
  float fVar3;
  float max;
  index_t local_34;
  uint local_30;
  index_t i_1;
  index_t j;
  index_t i;
  index_t local_20;
  index_t cmps;
  index_t stride_local;
  index_t num_local;
  float *coords_local;
  TBox<float> *b;
  
  j = 3;
  local_20 = stride;
  cmps = num;
  _stride_local = coords;
  coords_local = (float *)__return_storage_ptr__;
  puVar1 = std::min<unsigned_int>(&local_20,&j);
  i = *puVar1;
  fVar3 = std::numeric_limits<float>::max();
  max = std::numeric_limits<float>::lowest();
  TBox<float>::TBox(__return_storage_ptr__,fVar3,max);
  for (i_1 = 0; i_1 < cmps; i_1 = local_20 + i_1) {
    for (local_30 = 0; local_30 < i; local_30 = local_30 + 1) {
      fVar3 = _stride_local[i_1 + local_30];
      pfVar2 = glm::tvec3<float,_(glm::precision)0>::operator[]
                         (&__return_storage_ptr__->minCorner,local_30);
      if (fVar3 < *pfVar2) {
        fVar3 = _stride_local[i_1 + local_30];
        pfVar2 = glm::tvec3<float,_(glm::precision)0>::operator[]
                           (&__return_storage_ptr__->minCorner,local_30);
        *pfVar2 = fVar3;
      }
      fVar3 = _stride_local[i_1 + local_30];
      pfVar2 = glm::tvec3<float,_(glm::precision)0>::operator[]
                         (&__return_storage_ptr__->maxCorner,local_30);
      if (*pfVar2 <= fVar3 && fVar3 != *pfVar2) {
        fVar3 = _stride_local[i_1 + local_30];
        pfVar2 = glm::tvec3<float,_(glm::precision)0>::operator[]
                           (&__return_storage_ptr__->maxCorner,local_30);
        *pfVar2 = fVar3;
      }
    }
  }
  for (local_34 = local_20; local_34 < 3; local_34 = local_34 + 1) {
    pfVar2 = glm::tvec3<float,_(glm::precision)0>::operator[]
                       (&__return_storage_ptr__->minCorner,local_34);
    *pfVar2 = 0.0;
    pfVar2 = glm::tvec3<float,_(glm::precision)0>::operator[]
                       (&__return_storage_ptr__->maxCorner,local_34);
    *pfVar2 = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

TBox <real_t> BoxFromCoords (const real_t* coords, index_t num, index_t stride)
{
	const index_t cmps = std::min<index_t> (stride, 3);

	TBox <real_t> b (numeric_limits<real_t>::max(), numeric_limits<real_t>::lowest());
	for(index_t i = 0; i < num; i+=stride){
		for(index_t j = 0; j < cmps; ++j){
			if (coords [i+j] < b.minCorner[j])
				b.minCorner[j] = coords [i+j];
			if (coords [i+j] > b.maxCorner[j])
				b.maxCorner[j] = coords [i+j];
		}
	}

	for(index_t i = stride; i < 3; ++i){
		b.minCorner[i] = 0;
		b.maxCorner[i] = 0;
	}

	return b;
}